

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O1

bool __thiscall
cmCPackNSISGenerator::GetListOfSubdirectories
          (cmCPackNSISGenerator *this,char *topdir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  long *plVar5;
  ulong dindex;
  Directory dir;
  string fullPath;
  allocator<char> local_91;
  Directory local_90;
  string local_88;
  char *local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  cmCPackNSISGenerator *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_68 = topdir;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirs;
  local_58 = this;
  cmsys::Directory::Directory(&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,local_68,(allocator<char> *)local_50);
  cmsys::Directory::Load(&local_90,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  dindex = 0;
  while( true ) {
    uVar3 = cmsys::Directory::GetNumberOfFiles(&local_90);
    if (uVar3 <= dindex) break;
    pcVar4 = cmsys::Directory::GetFile(&local_90,dindex);
    iVar2 = strcmp(pcVar4,".");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar4,"..");
      if (iVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_68,&local_91);
        pcVar4 = (char *)std::__cxx11::string::append((char *)local_50);
        plVar5 = (long *)std::__cxx11::string::append(pcVar4);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar5,plVar5[1] + *plVar5);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        bVar1 = cmsys::SystemTools::FileIsDirectory(&local_88);
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileIsSymlink(&local_88);
          if (!bVar1) {
            GetListOfSubdirectories
                      (local_58,local_88._M_dataplus._M_p,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
    }
    dindex = dindex + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            (local_60,&local_68);
  cmsys::Directory::~Directory(&local_90);
  return true;
}

Assistant:

bool cmCPackNSISGenerator::GetListOfSubdirectories(
  const char* topdir, std::vector<std::string>& dirs)
{
  cmsys::Directory dir;
  dir.Load(topdir);
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      std::string const fullPath =
        std::string(topdir).append("/").append(fileName);
      if (cmsys::SystemTools::FileIsDirectory(fullPath) &&
          !cmsys::SystemTools::FileIsSymlink(fullPath)) {
        if (!this->GetListOfSubdirectories(fullPath.c_str(), dirs)) {
          return false;
        }
      }
    }
  }
  dirs.emplace_back(topdir);
  return true;
}